

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::NavScoreItem(ImGuiNavItemData *result)

{
  uint uVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  uint uVar6;
  long in_RDI;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImGuiDir move_dir;
  bool new_best;
  float dist_axial;
  float day;
  float dax;
  ImGuiDir quadrant;
  float dist_center;
  float dcy;
  float dcx;
  float dist_box;
  float dby;
  float dbx;
  ImRect curr;
  ImRect cand;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *in_stack_ffffffffffffff78;
  float local_80;
  ImGuiDir in_stack_ffffffffffffff84;
  bool local_69;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  float local_44;
  float local_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  ImRect local_30;
  ImGuiWindow *local_20;
  ImGuiContext *local_18;
  long local_10;
  bool local_1;
  
  pIVar4 = GImGui;
  local_18 = GImGui;
  local_20 = GImGui->CurrentWindow;
  if (GImGui->NavLayer == (local_20->DC).NavLayerCurrent) {
    local_30.Min = (GImGui->LastItemData).NavRect.Min;
    local_30.Max = (GImGui->LastItemData).NavRect.Max;
    IVar2 = (GImGui->NavScoringRect).Min;
    IVar3 = (GImGui->NavScoringRect).Max;
    GImGui->NavScoringDebugCount = GImGui->NavScoringDebugCount + 1;
    local_10 = in_RDI;
    if (local_20->ParentWindow == pIVar4->NavWindow) {
      bVar5 = ImRect::Overlaps(&local_20->ClipRect,&local_30);
      if (!bVar5) {
        return false;
      }
      ImRect::ClipWithFull
                ((ImRect *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (ImRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
    NavClampRectToVisibleAreaForMoveDir
              (in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,(ImRect *)0x13e324);
    local_40 = IVar2.x;
    local_38 = IVar3.x;
    local_44 = NavScoreItemDistInterval(local_30.Min.x,local_30.Max.x,local_40,local_38);
    fVar7 = ImLerp<float>(local_30.Min.y,local_30.Max.y,0.2);
    fVar8 = ImLerp<float>(local_30.Min.y,local_30.Max.y,0.8);
    fStack_3c = IVar2.y;
    fStack_34 = IVar3.y;
    fVar9 = ImLerp<float>(fStack_3c,fStack_34,0.2);
    fVar10 = ImLerp<float>(fStack_3c,fStack_34,0.8);
    local_80 = NavScoreItemDistInterval(fVar7,fVar8,fVar9,fVar10);
    if (((local_80 != 0.0) || (NAN(local_80))) && ((local_44 != 0.0 || (NAN(local_44))))) {
      local_44 = local_44 / 1000.0 +
                 (float)(~-(uint)(0.0 < local_44) & 0xbf800000 |
                        -(uint)(0.0 < local_44) & 0x3f800000);
    }
    fVar10 = ABS(local_44) + ABS(local_80);
    fVar9 = (local_30.Min.x + local_30.Max.x) - (local_40 + local_38);
    fVar8 = (local_30.Min.y + local_30.Max.y) - (fStack_3c + fStack_34);
    fVar11 = ABS(fVar9) + ABS(fVar8);
    fVar7 = 0.0;
    if (((local_44 != 0.0) || (local_80 != 0.0)) || (NAN(local_80))) {
      fVar7 = fVar10;
      fVar8 = local_80;
      fVar9 = local_44;
      uVar6 = ImGetDirQuadrantFromDelta(local_44,local_80);
    }
    else if (((fVar9 != 0.0) || (fVar8 != 0.0)) || (NAN(fVar8))) {
      fVar7 = fVar11;
      uVar6 = ImGetDirQuadrantFromDelta(fVar9,fVar8);
    }
    else {
      uVar6 = (uint)(local_18->NavId <= (local_18->LastItemData).ID);
      fVar8 = 0.0;
      fVar9 = 0.0;
    }
    local_69 = false;
    uVar1 = local_18->NavMoveDir;
    if (uVar6 == uVar1) {
      if (fVar10 < *(float *)(local_10 + 0x24)) {
        *(float *)(local_10 + 0x24) = fVar10;
        *(float *)(local_10 + 0x28) = fVar11;
        return true;
      }
      if ((fVar10 == *(float *)(local_10 + 0x24)) &&
         (!NAN(fVar10) && !NAN(*(float *)(local_10 + 0x24)))) {
        if (*(float *)(local_10 + 0x28) <= fVar11) {
          if ((fVar11 == *(float *)(local_10 + 0x28)) &&
             (!NAN(fVar11) && !NAN(*(float *)(local_10 + 0x28)))) {
            if ((uVar1 != 2) && (uVar1 != 3)) {
              local_80 = local_44;
            }
            local_69 = local_80 < 0.0;
          }
        }
        else {
          *(float *)(local_10 + 0x28) = fVar11;
          local_69 = true;
        }
      }
    }
    if (((((*(float *)(local_10 + 0x24) == 3.4028235e+38) && (!NAN(*(float *)(local_10 + 0x24)))) &&
         (fVar7 < *(float *)(local_10 + 0x2c))) &&
        ((local_18->NavLayer == ImGuiNavLayer_Menu &&
         ((local_18->NavWindow->Flags & 0x10000000U) == 0)))) &&
       (((((uVar1 == 0 && (fVar9 < 0.0)) || ((uVar1 == 1 && (0.0 < fVar9)))) ||
         ((uVar1 == 2 && (fVar8 < 0.0)))) || ((uVar1 == 3 && (0.0 < fVar8)))))) {
      *(float *)(local_10 + 0x2c) = fVar7;
      local_69 = true;
    }
    local_1 = local_69;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool ImGui::NavScoreItem(ImGuiNavItemData* result)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavLayer != window->DC.NavLayerCurrent)
        return false;

    // FIXME: Those are not good variables names
    ImRect cand = g.LastItemData.NavRect;   // Current item nav rectangle
    const ImRect curr = g.NavScoringRect;   // Current modified source rect (NB: we've applied Max.x = Min.x in NavUpdate() to inhibit the effect of having varied item width)
    g.NavScoringDebugCount++;

    // When entering through a NavFlattened border, we consider child window items as fully clipped for scoring
    if (window->ParentWindow == g.NavWindow)
    {
        IM_ASSERT((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened);
        if (!window->ClipRect.Overlaps(cand))
            return false;
        cand.ClipWithFull(window->ClipRect); // This allows the scored item to not overlap other candidates in the parent window
    }

    // We perform scoring on items bounding box clipped by the current clipping rectangle on the other axis (clipping on our movement axis would give us equal scores for all clipped items)
    // For example, this ensure that items in one column are not reached when moving vertically from items in another column.
    NavClampRectToVisibleAreaForMoveDir(g.NavMoveClipDir, cand, window->ClipRect);

    // Compute distance between boxes
    // FIXME-NAV: Introducing biases for vertical navigation, needs to be removed.
    float dbx = NavScoreItemDistInterval(cand.Min.x, cand.Max.x, curr.Min.x, curr.Max.x);
    float dby = NavScoreItemDistInterval(ImLerp(cand.Min.y, cand.Max.y, 0.2f), ImLerp(cand.Min.y, cand.Max.y, 0.8f), ImLerp(curr.Min.y, curr.Max.y, 0.2f), ImLerp(curr.Min.y, curr.Max.y, 0.8f)); // Scale down on Y to keep using box-distance for vertically touching items
    if (dby != 0.0f && dbx != 0.0f)
        dbx = (dbx / 1000.0f) + ((dbx > 0.0f) ? +1.0f : -1.0f);
    float dist_box = ImFabs(dbx) + ImFabs(dby);

    // Compute distance between centers (this is off by a factor of 2, but we only compare center distances with each other so it doesn't matter)
    float dcx = (cand.Min.x + cand.Max.x) - (curr.Min.x + curr.Max.x);
    float dcy = (cand.Min.y + cand.Max.y) - (curr.Min.y + curr.Max.y);
    float dist_center = ImFabs(dcx) + ImFabs(dcy); // L1 metric (need this for our connectedness guarantee)

    // Determine which quadrant of 'curr' our candidate item 'cand' lies in based on distance
    ImGuiDir quadrant;
    float dax = 0.0f, day = 0.0f, dist_axial = 0.0f;
    if (dbx != 0.0f || dby != 0.0f)
    {
        // For non-overlapping boxes, use distance between boxes
        dax = dbx;
        day = dby;
        dist_axial = dist_box;
        quadrant = ImGetDirQuadrantFromDelta(dbx, dby);
    }
    else if (dcx != 0.0f || dcy != 0.0f)
    {
        // For overlapping boxes with different centers, use distance between centers
        dax = dcx;
        day = dcy;
        dist_axial = dist_center;
        quadrant = ImGetDirQuadrantFromDelta(dcx, dcy);
    }
    else
    {
        // Degenerate case: two overlapping buttons with same center, break ties arbitrarily (note that LastItemId here is really the _previous_ item order, but it doesn't matter)
        quadrant = (g.LastItemData.ID < g.NavId) ? ImGuiDir_Left : ImGuiDir_Right;
    }

#if IMGUI_DEBUG_NAV_SCORING
    char buf[128];
    if (IsMouseHoveringRect(cand.Min, cand.Max))
    {
        ImFormatString(buf, IM_ARRAYSIZE(buf), "dbox (%.2f,%.2f->%.4f)\ndcen (%.2f,%.2f->%.4f)\nd (%.2f,%.2f->%.4f)\nnav %c, quadrant %c", dbx, dby, dist_box, dcx, dcy, dist_center, dax, day, dist_axial, "WENS"[g.NavMoveDir], "WENS"[quadrant]);
        ImDrawList* draw_list = GetForegroundDrawList(window);
        draw_list->AddRect(curr.Min, curr.Max, IM_COL32(255,200,0,100));
        draw_list->AddRect(cand.Min, cand.Max, IM_COL32(255,255,0,200));
        draw_list->AddRectFilled(cand.Max - ImVec2(4, 4), cand.Max + CalcTextSize(buf) + ImVec2(4, 4), IM_COL32(40,0,0,150));
        draw_list->AddText(cand.Max, ~0U, buf);
    }
    else if (g.IO.KeyCtrl) // Hold to preview score in matching quadrant. Press C to rotate.
    {
        if (quadrant == g.NavMoveDir)
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "%.0f/%.0f", dist_box, dist_center);
            ImDrawList* draw_list = GetForegroundDrawList(window);
            draw_list->AddRectFilled(cand.Min, cand.Max, IM_COL32(255, 0, 0, 200));
            draw_list->AddText(cand.Min, IM_COL32(255, 255, 255, 255), buf);
        }
    }
#endif

    // Is it in the quadrant we're interesting in moving to?
    bool new_best = false;
    const ImGuiDir move_dir = g.NavMoveDir;
    if (quadrant == move_dir)
    {
        // Does it beat the current best candidate?
        if (dist_box < result->DistBox)
        {
            result->DistBox = dist_box;
            result->DistCenter = dist_center;
            return true;
        }
        if (dist_box == result->DistBox)
        {
            // Try using distance between center points to break ties
            if (dist_center < result->DistCenter)
            {
                result->DistCenter = dist_center;
                new_best = true;
            }
            else if (dist_center == result->DistCenter)
            {
                // Still tied! we need to be extra-careful to make sure everything gets linked properly. We consistently break ties by symbolically moving "later" items
                // (with higher index) to the right/downwards by an infinitesimal amount since we the current "best" button already (so it must have a lower index),
                // this is fairly easy. This rule ensures that all buttons with dx==dy==0 will end up being linked in order of appearance along the x axis.
                if (((move_dir == ImGuiDir_Up || move_dir == ImGuiDir_Down) ? dby : dbx) < 0.0f) // moving bj to the right/down decreases distance
                    new_best = true;
            }
        }
    }

    // Axial check: if 'curr' has no link at all in some direction and 'cand' lies roughly in that direction, add a tentative link. This will only be kept if no "real" matches
    // are found, so it only augments the graph produced by the above method using extra links. (important, since it doesn't guarantee strong connectedness)
    // This is just to avoid buttons having no links in a particular direction when there's a suitable neighbor. you get good graphs without this too.
    // 2017/09/29: FIXME: This now currently only enabled inside menu bars, ideally we'd disable it everywhere. Menus in particular need to catch failure. For general navigation it feels awkward.
    // Disabling it may lead to disconnected graphs when nodes are very spaced out on different axis. Perhaps consider offering this as an option?
    if (result->DistBox == FLT_MAX && dist_axial < result->DistAxial)  // Check axial match
        if (g.NavLayer == ImGuiNavLayer_Menu && !(g.NavWindow->Flags & ImGuiWindowFlags_ChildMenu))
            if ((move_dir == ImGuiDir_Left && dax < 0.0f) || (move_dir == ImGuiDir_Right && dax > 0.0f) || (move_dir == ImGuiDir_Up && day < 0.0f) || (move_dir == ImGuiDir_Down && day > 0.0f))
            {
                result->DistAxial = dist_axial;
                new_best = true;
            }

    return new_best;
}